

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::convertToXYZ_chrm
               (float *im,uint w,uint h,LodePNGInfo *info,uint use_icc,LodePNGICC *icc,
               float *whitepoint)

{
  uint uVar1;
  uint extraout_EAX;
  ulong uVar2;
  float *z2;
  bool bVar3;
  float afStack_58 [12];
  
  uVar1 = getChrm(afStack_58,whitepoint,use_icc,icc,info);
  if ((uVar1 == 0) && ((use_icc == 0 || (icc->inputspace == 2)))) {
    uVar2 = (ulong)(h * w);
    z2 = im + 2;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      mulMatrix(z2 + -2,z2 + -1,z2,afStack_58,(double)z2[-2],(double)z2[-1],(double)*z2);
      z2 = z2 + 4;
      uVar1 = extraout_EAX;
    }
  }
  return uVar1;
}

Assistant:

static unsigned convertToXYZ_chrm(float* im, unsigned w, unsigned h,
                                  const LodePNGInfo* info, unsigned use_icc, const LodePNGICC* icc,
                                  float whitepoint[3]) {
  unsigned error = 0;
  size_t i;
  size_t n = w * h;
  float m[9]; /* XYZ to linear RGB matrix */

  /* Must be called even for grayscale, to get the correct whitepoint to output */
  error = getChrm(m, whitepoint, use_icc, icc, info);
  if(error) return error;

  /* Note: no whitepoint adaptation done to m here, because we only do the
  adaptation in convertFromXYZ (we only whitepoint adapt when going to the
  target RGB space, but here we're going from the source RGB space to XYZ) */

  /* Apply the above computed linear-RGB-to-XYZ matrix to the pixels.
  Skip the transform if it's the unit matrix (which is the case if grayscale profile) */
  if(!use_icc || icc->inputspace == 2) {
    for(i = 0; i < n; i++) {
      size_t j = i * 4;
      mulMatrix(&im[j + 0], &im[j + 1], &im[j + 2], m, im[j + 0], im[j + 1], im[j + 2]);
    }
  }

  return 0;
}